

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu_test.c
# Opt level: O1

void benchmark_rmu_uncontended_waiter(testing t)

{
  int iVar1;
  closure *cl;
  int value;
  nsync_mu mu;
  undefined4 local_2c;
  nsync_mu local_28;
  
  iVar1 = testing_n(t);
  local_2c = 0;
  nsync::nsync_mu_init(&local_28);
  cl = (closure *)malloc(0x20);
  cl->f0 = closure_f0_waiter;
  cl[1].f0 = waiter;
  cl[2].f0 = (_func_void_void_ptr *)&local_28;
  cl[3].f0 = (_func_void_void_ptr *)&local_2c;
  closure_fork(cl);
  nsync::nsync_mu_lock(&local_28);
  nsync::nsync_mu_wait(&local_28,int_is_1,&local_2c,(_func_int_void_ptr_void_ptr *)0x0);
  nsync::nsync_mu_unlock(&local_28);
  if (iVar1 != 0) {
    do {
      nsync::nsync_mu_rlock(&local_28);
      nsync::nsync_mu_runlock(&local_28);
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  nsync::nsync_mu_lock(&local_28);
  local_2c = 2;
  nsync::nsync_mu_wait(&local_28,int_is_3,&local_2c,(_func_int_void_ptr_void_ptr *)0x0);
  nsync::nsync_mu_unlock(&local_28);
  return;
}

Assistant:

static void benchmark_rmu_uncontended_waiter (testing t) {
	int i;
	int n = testing_n (t);
	nsync_mu mu;
	int value = 0;
	nsync_mu_init (&mu);
	closure_fork (closure_waiter (&waiter, &mu, &value));
	nsync_mu_lock (&mu);
	nsync_mu_wait (&mu, &int_is_1, &value, NULL);
	nsync_mu_unlock (&mu);
	for (i = 0; i != n; i++) {
		nsync_mu_rlock (&mu);
		nsync_mu_runlock (&mu);
	}
	nsync_mu_lock (&mu);
	value = 2;
	nsync_mu_wait (&mu, &int_is_3, &value, NULL);
	nsync_mu_unlock (&mu);
}